

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_guarded_opt.hpp
# Opt level: O0

shared_handle * __thiscall
gmlc::libguarded::
shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
::lock_shared(shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
              *this)

{
  shared_lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_RSI;
  pointer in_RDI;
  pointer in_stack_ffffffffffffffa8;
  pointer val;
  shared_lock<std::shared_mutex> local_20 [2];
  
  if ((in_RSI[8].m_handle_lock._M_owns & 1U) == 0) {
    val = in_RDI;
    std::shared_lock<std::shared_mutex>::shared_lock(local_20);
    shared_lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
    ::shared_lock_handle(in_RSI,val,(lock_type *)in_RDI);
    std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)in_RDI);
  }
  else {
    shared_lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
    ::shared_lock_handle
              ((shared_lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
                *)in_RDI,in_stack_ffffffffffffffa8,(shared_mutex *)0x30d42d);
    val = in_RDI;
  }
  return (shared_handle *)val;
}

Assistant:

auto shared_guarded_opt<T, M>::lock_shared() const -> shared_handle
{
    return (enabled) ?
        shared_handle(&m_obj, m_mutex) :
        shared_handle(&m_obj, typename shared_locker<M>::locker_type{});
}